

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::FboTestCase::iterate(FboTestCase *this)

{
  undefined8 log_00;
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  RenderContext *context_00;
  undefined4 extraout_var;
  char *pcVar7;
  Error *this_01;
  PixelFormat *pPVar8;
  Enum<int,_2UL> EVar9;
  undefined1 local_6578 [7];
  bool isOk;
  MultisamplePixelBufferAccess local_6550;
  MultisamplePixelBufferAccess local_6528;
  ReferenceContextLimits local_6500;
  undefined1 local_64a8 [8];
  ReferenceContext context_1;
  undefined1 local_2e8 [8];
  ReferenceContextBuffers buffers;
  FboIncompleteException *e;
  GetNameFunc local_248;
  int local_240;
  string local_238;
  deUint32 local_214;
  deUint32 err;
  undefined1 local_200 [8];
  GLContext context;
  Surface result;
  Surface reference;
  int y;
  int x;
  int height;
  undefined1 local_40 [4];
  int width;
  Random rnd;
  TestLog *log;
  RenderTarget *renderTarget;
  RenderContext *renderCtx;
  FboTestCase *this_local;
  RenderTarget *this_00;
  
  context_00 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*context_00->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var,iVar1);
  rnd.m_rnd._8_8_ =
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar7);
  de::Random::Random((Random *)local_40,dVar2);
  iVar1 = tcu::RenderTarget::getWidth(this_00);
  iVar1 = ::deMin32(iVar1,this->m_viewportWidth);
  iVar3 = tcu::RenderTarget::getHeight(this_00);
  iVar3 = ::deMin32(iVar3,this->m_viewportHeight);
  iVar4 = tcu::RenderTarget::getWidth(this_00);
  iVar4 = de::Random::getInt((Random *)local_40,0,iVar4 - iVar1);
  iVar5 = tcu::RenderTarget::getHeight(this_00);
  iVar5 = de::Random::getInt((Random *)local_40,0,iVar5 - iVar3);
  tcu::Surface::Surface((Surface *)&result.m_pixels.m_cap);
  tcu::Surface::Surface
            ((Surface *)
             &context.m_programs.
              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  log_00 = rnd.m_rnd._8_8_;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&stack0xfffffffffffffdf0,iVar4,iVar5,iVar1,iVar3);
  sglr::GLContext::GLContext
            ((GLContext *)local_200,context_00,(TestLog *)log_00,1,(IVec4 *)&stack0xfffffffffffffdf0
            );
  sglr::ContextWrapper::setContext(&this->super_ContextWrapper,(Context *)local_200);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&context.m_programs.
                   super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_214 = sglr::ContextWrapper::glGetError(&this->super_ContextWrapper);
  if (local_214 != 0) {
    this_01 = (Error *)__cxa_allocate_exception(0x38);
    dVar2 = local_214;
    EVar9 = glu::getErrorStr(local_214);
    local_248 = EVar9.m_getName;
    local_240 = EVar9.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_238,&local_248);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    glu::Error::Error(this_01,dVar2,pcVar7,(char *)0x0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboTestCase.cpp"
                      ,0x5a);
    __cxa_throw(this_01,&glu::Error::typeinfo,glu::Error::~Error);
  }
  sglr::ContextWrapper::setContext(&this->super_ContextWrapper,(Context *)0x0);
  sglr::GLContext::~GLContext((GLContext *)local_200);
  pPVar8 = tcu::RenderTarget::getPixelFormat(this_00);
  tcu::PixelFormat::PixelFormat
            ((PixelFormat *)
             &context_1.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,8,8,8,(uint)(pPVar8->alphaBits != 0) << 3);
  iVar4 = tcu::RenderTarget::getDepthBits(this_00);
  iVar5 = tcu::RenderTarget::getStencilBits(this_00);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            ((ReferenceContextBuffers *)local_2e8,
             (PixelFormat *)
             &context_1.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,iVar4,iVar5,iVar1,iVar3,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits(&local_6500,context_00);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_6528,(ReferenceContextBuffers *)local_2e8);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_6550,(ReferenceContextBuffers *)local_2e8);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)local_6578,(ReferenceContextBuffers *)local_2e8);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)local_64a8,&local_6500,&local_6528,&local_6550,
             (MultisamplePixelBufferAccess *)local_6578);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_6500);
  sglr::ContextWrapper::setContext(&this->super_ContextWrapper,(Context *)local_64a8);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&result.m_pixels.m_cap);
  sglr::ContextWrapper::setContext(&this->super_ContextWrapper,(Context *)0x0);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_64a8);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers((ReferenceContextBuffers *)local_2e8);
  uVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                    (this,&result.m_pixels.m_cap,
                     &context.m_programs.
                      super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar7 = "Image comparison failed";
  if ((uVar6 & 1) != 0) {
    pcVar7 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~((byte)uVar6 & 1) & QP_TEST_RESULT_FAIL,pcVar7);
  buffers.m_stencilbuffer.m_data.m_cap._4_4_ = 1;
  tcu::Surface::~Surface
            ((Surface *)
             &context.m_programs.
              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface((Surface *)&result.m_pixels.m_cap);
  de::Random::~Random((Random *)local_40);
  return STOP;
}

Assistant:

FboTestCase::IterateResult FboTestCase::iterate (void)
{
	glu::RenderContext&			renderCtx		= TestCase::m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget	= renderCtx.getRenderTarget();
	TestLog&					log				= m_testCtx.getLog();

	// Viewport.
	de::Random					rnd				(deStringHash(getName()));
	int							width			= deMin32(renderTarget.getWidth(),	m_viewportWidth);
	int							height			= deMin32(renderTarget.getHeight(),	m_viewportHeight);
	int							x				= rnd.getInt(0, renderTarget.getWidth()		- width);
	int							y				= rnd.getInt(0, renderTarget.getHeight()	- height);

	// Surface format and storage is choosen by render().
	tcu::Surface				reference;
	tcu::Surface				result;

	// Call preCheck() that can throw exception if some requirement is not met.
	preCheck();

	// Render using GLES3.
	try
	{
		sglr::GLContext context(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));
		setContext(&context);
		render(result);

		// Check error.
		deUint32 err = glGetError();
		if (err != GL_NO_ERROR)
			throw glu::Error(err, glu::getErrorStr(err).toString().c_str(), DE_NULL, __FILE__, __LINE__);

		setContext(DE_NULL);
	}
	catch (const FboTestUtil::FboIncompleteException& e)
	{
		if (e.getReason() == GL_FRAMEBUFFER_UNSUPPORTED)
		{
			log << e;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
			return STOP;
		}
		else
			throw;
	}

	// Render reference.
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		setContext(&context);
		render(reference);
		setContext(DE_NULL);
	}

	bool isOk = compare(reference, result);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");
	return STOP;
}